

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

void __thiscall
llvm::DWARFDebugLine::LineTable::dump(LineTable *this,raw_ostream *OS,DIDumpOptions DumpOptions)

{
  char *pcVar1;
  pointer pRVar2;
  raw_ostream *this_00;
  size_t in_RCX;
  size_t __n;
  void *__buf;
  Row *R;
  pointer this_01;
  
  Prologue::dump(&this->Prologue,OS,DumpOptions);
  pcVar1 = OS->OutBufCur;
  if (pcVar1 < OS->OutBufEnd) {
    OS->OutBufCur = pcVar1 + 1;
    *pcVar1 = '\n';
  }
  else {
    raw_ostream::write(OS,10,__buf,in_RCX);
  }
  if ((this->Rows).
      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->Rows).
      super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __n = (long)OS->OutBufEnd - (long)OS->OutBufCur;
    if (__n < 0x40) {
      this_00 = (raw_ostream *)raw_ostream::write(OS,0xbde675,(void *)0x40,__n);
    }
    else {
      builtin_strncpy(OS->OutBufCur,
                      "Address            Line   Column File   ISA Discriminator Flags\n",0x40);
      OS->OutBufCur = OS->OutBufCur + 0x40;
      this_00 = OS;
    }
    if ((ulong)((long)this_00->OutBufEnd - (long)this_00->OutBufCur) < 0x48) {
      raw_ostream::write(this_00,0xbde6b6,&DAT_00000048,__n);
    }
    else {
      memcpy(this_00->OutBufCur,
             "------------------ ------ ------ ------ --- ------------- -------------\n",0x48);
      this_00->OutBufCur = this_00->OutBufCur + 0x48;
    }
    pRVar2 = (this->Rows).
             super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_01 = (this->Rows).
                   super__Vector_base<llvm::DWARFDebugLine::Row,_std::allocator<llvm::DWARFDebugLine::Row>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_01 != pRVar2;
        this_01 = this_01 + 1) {
      Row::dump(this_01,OS);
    }
  }
  return;
}

Assistant:

void DWARFDebugLine::LineTable::dump(raw_ostream &OS,
                                     DIDumpOptions DumpOptions) const {
  Prologue.dump(OS, DumpOptions);
  OS << '\n';

  if (!Rows.empty()) {
    Row::dumpTableHeader(OS);
    for (const Row &R : Rows) {
      R.dump(OS);
    }
  }
}